

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O1

int ly_register_types(lytype_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  char *pcVar2;
  lytype_store_clb p_Var3;
  ulong uVar4;
  uint16_t uVar5;
  int iVar6;
  lytype_plugin_list *plVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  char *__s1;
  char *pcVar12;
  lytype_plugin_list *local_38;
  
  plVar7 = type_plugins;
  uVar5 = type_plugins_count;
  pcVar12 = plugin->name;
  if (pcVar12 == (char *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar4 = (ulong)type_plugins_count;
    uVar11 = 0;
    local_38 = plugin;
    do {
      if (uVar5 != 0) {
        lVar9 = 0;
        do {
          iVar6 = strcmp(pcVar12,*(char **)((long)&plVar7->name + lVar9));
          if (iVar6 == 0) {
            pcVar2 = local_38->module;
            iVar6 = strcmp(pcVar2,*(char **)((long)&plVar7->module + lVar9));
            if (iVar6 == 0) {
              __s1 = local_38->revision;
              if (__s1 == (char *)0x0) {
                __s1 = "";
                pcVar8 = "";
LAB_00172798:
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                       "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                       ,log_name,pcVar12,pcVar2,pcVar8,__s1);
                return 1;
              }
              pcVar8 = *(char **)((long)&plVar7->revision + lVar9);
              if ((pcVar8 == (char *)0x0) || (iVar6 = strcmp(__s1,pcVar8), iVar6 == 0)) {
                pcVar8 = "@";
                goto LAB_00172798;
              }
            }
          }
          lVar9 = lVar9 + 0x28;
        } while (uVar4 * 0x28 != lVar9);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
      local_38 = plugin + uVar11;
      pcVar12 = local_38->name;
    } while (pcVar12 != (char *)0x0);
  }
  plVar7 = (lytype_plugin_list *)realloc(type_plugins,(ulong)(type_plugins_count + uVar10) * 0x28);
  if (plVar7 == (lytype_plugin_list *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_types");
    iVar6 = -1;
  }
  else {
    iVar6 = 0;
    type_plugins = plVar7;
    if (uVar10 != 0) {
      lVar9 = (ulong)uVar10 * 0x28;
      do {
        plVar7[type_plugins_count].free_clb = *(_func_void_void_ptr **)((long)plugin + lVar9 + -8);
        puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar9);
        pcVar12 = (char *)*puVar1;
        pcVar2 = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)plugin + lVar9 + -0x18);
        p_Var3 = (lytype_store_clb)puVar1[1];
        plVar7[type_plugins_count].name = (char *)*puVar1;
        (&plVar7[type_plugins_count].name)[1] = (char *)p_Var3;
        plVar7[type_plugins_count].module = pcVar12;
        plVar7[type_plugins_count].revision = pcVar2;
        type_plugins_count = type_plugins_count + 1;
        lVar9 = lVar9 + -0x28;
        iVar6 = 0;
      } while (lVar9 != 0);
    }
  }
  return iVar6;
}

Assistant:

API int
ly_register_types(struct lytype_plugin_list *plugin, const char *log_name)
{
    struct lytype_plugin_list *p;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check user type implementations for collisions */
        for (v = 0; v < type_plugins_count; v++) {
            if (!strcmp(plugin[u].name, type_plugins[v].name) &&
                    !strcmp(plugin[u].module, type_plugins[v].module) &&
                    (!plugin[u].revision || !type_plugins[v].revision || !strcmp(plugin[u].revision, type_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(type_plugins, (type_plugins_count + u) * sizeof *type_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    type_plugins = p;
    for (; u; u--) {
        memcpy(&type_plugins[type_plugins_count], &plugin[u - 1], sizeof *plugin);
        type_plugins_count++;
    }

    return 0;
}